

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O3

bool __thiscall
nuraft::raft_server::snapshot_and_compact
          (raft_server *this,ulong committed_idx,bool forced_creation)

{
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  long *plVar5;
  undefined8 this_00;
  thread tVar6;
  snapshot *psVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  unsigned_long uVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  buffer *buf;
  _func_int **pp_Var14;
  uint64_t uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int *p_Var16;
  bool bVar17;
  bool bVar18;
  handler_type handler;
  ptr<log_entry> conf_log;
  ptr<snapshot> new_snapshot;
  ulong log_term_to_compact;
  ptr<raft_params> params;
  ptr<snapshot> local_snp;
  _func_int **local_100;
  undefined1 local_f8 [24];
  thread tStack_e0;
  thread local_d8;
  EventAwaiter *pEStack_d0;
  undefined1 local_c8 [24];
  undefined1 local_b0 [48];
  snapshot *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  unsigned_long local_70;
  undefined1 local_68 [32];
  string local_48;
  
  local_100 = (_func_int **)committed_idx;
  context::get_params((context *)local_68);
  get_config((raft_server *)local_f8);
  uVar1 = *(ulong *)(local_f8._0_8_ + 8);
  uVar12 = (**(code **)(*(long *)(this->log_store_).
                                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x10))();
  if (uVar1 < uVar12) {
    p_Var16 = (_func_int *)(long)*(int *)(local_68._0_8_ + 0x18);
    if ((*(char *)(local_68._0_8_ + 0x20) == '\x01') &&
       (((this->snp_in_progress_)._M_base._M_i & 1U) == 0)) {
      get_last_snapshot((raft_server *)local_c8);
      if ((log_entry *)local_c8._0_8_ == (log_entry *)0x0) {
        bVar17 = *(int *)(local_68._0_8_ + 0x18) != 0;
      }
      else {
        bVar17 = false;
      }
      if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      if (bVar17) {
        p_Var16 = (_func_int *)(ulong)this->first_snapshot_distance_;
      }
    }
    pp_Var14 = local_100;
    if ((forced_creation) ||
       (((*(int *)(local_68._0_8_ + 0x18) != 0 &&
         (lVar13 = (**(code **)(*(long *)(this->log_store_).
                                         super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x18))(),
         p_Var16 <= (_func_int *)((long)pp_Var14 + (1 - lVar13)))) &&
        (cVar10 = (**(code **)(*(long *)(this->state_machine_).
                                        super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x98))(), cVar10 != '\0')))) {
      get_last_snapshot((raft_server *)(local_68 + 0x10));
      if (((forced_creation) || (local_68._16_8_ == 0)) ||
         (p_Var16 <= (_func_int *)((long)local_100 - *(long *)local_68._16_8_))) {
        bVar17 = false;
        LOCK();
        bVar18 = (this->snp_in_progress_)._M_base._M_i == false;
        if (bVar18) {
          (this->snp_in_progress_)._M_base._M_i = true;
        }
        UNLOCK();
        if (bVar18) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 != (element_type *)0x0) &&
             (iVar11 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar11)) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_c8,"creating a snapshot for index %lu",local_100);
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x209,local_c8);
            if ((log_entry *)local_c8._0_8_ != (log_entry *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
          }
          pp_Var14 = *(_func_int ***)local_f8._0_8_;
          if (local_100 < pp_Var14) {
            do {
              uVar1 = *(ulong *)(local_f8._0_8_ + 8);
              uVar12 = (**(code **)(*(long *)(this->log_store_).
                                             super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + 0x18))();
              if (uVar1 < uVar12) {
                pp_Var14 = *(_func_int ***)local_f8._0_8_;
                break;
              }
              peVar3 = (this->log_store_).
                       super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (**(code **)(*(long *)peVar3 + 0x50))(local_c8,peVar3,*(ulong *)(local_f8._0_8_ + 8));
              buf = log_entry::get_buf((log_entry *)local_c8._0_8_);
              cluster_config::deserialize((cluster_config *)(local_f8 + 0x10),buf);
              tVar6._M_id._M_thread = tStack_e0._M_id._M_thread;
              local_f8._0_8_ = local_f8._16_8_;
              this_00 = local_f8._8_8_;
              local_f8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              tStack_e0._M_id._M_thread = (id)0;
              local_f8._8_8_ = tVar6._M_id._M_thread;
              if (((element_type *)this_00 != (element_type *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
                 tStack_e0._M_id._M_thread != 0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tStack_e0._M_id._M_thread
                          );
              }
              if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
              }
              pp_Var14 = *(_func_int ***)local_f8._0_8_;
            } while (local_100 < pp_Var14);
          }
          if ((local_100 < pp_Var14) && (uVar1 = *(ulong *)(local_f8._0_8_ + 8), uVar1 != 0)) {
            uVar12 = (**(code **)(*(long *)(this->log_store_).
                                           super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + 0x18))();
            if (uVar12 <= uVar1) {
              pp_Var14 = *(_func_int ***)local_f8._0_8_;
              goto LAB_001be9f9;
            }
            if ((long *)local_68._16_8_ == (long *)0x0) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if ((peVar2 != (element_type *)0x0) &&
                 (iVar11 = (**(code **)(*(long *)peVar2 + 0x38))(), 1 < iVar11)) {
                peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                msg_if_given_abi_cxx11_
                          ((string *)local_c8,
                           "No snapshot could be found while no configuration cannot be found in current committed logs, this is a system error, exiting"
                          );
                (**(code **)(*(long *)peVar2 + 0x40))
                          (peVar2,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                           ,"snapshot_and_compact",0x219,local_c8);
                if ((log_entry *)local_c8._0_8_ != (log_entry *)(local_c8 + 0x10)) {
                  operator_delete((void *)local_c8._0_8_);
                }
              }
              plVar5 = *(long **)(this->ctx_)._M_t.
                                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                 .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
              (**(code **)(*plVar5 + 0x40))(plVar5,0xfffffffa);
              exit(-1);
            }
            local_f8._0_8_ = *(long *)(local_68._16_8_ + 0x18);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68._16_8_ + 0x20));
          }
          else {
LAB_001be9f9:
            if ((((local_100 < pp_Var14) && (*(ulong *)(local_f8._0_8_ + 8) == 0)) &&
                (peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr, peVar2 != (element_type *)0x0)) &&
               (iVar11 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar11)) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)local_c8,
                         "config at log idx 1 is not availabe, config log idx %lu, prev log idx %lu, committed idx %lu"
                         ,*(_func_int ***)local_f8._0_8_,*(ulong *)(local_f8._0_8_ + 8),local_100);
              (**(code **)(*(long *)peVar2 + 0x40))
                        (peVar2,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                         ,"snapshot_and_compact",0x22a,local_c8);
              if ((log_entry *)local_c8._0_8_ != (log_entry *)(local_c8 + 0x10)) {
                operator_delete((void *)local_c8._0_8_);
              }
            }
          }
          peVar3 = (this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_70 = (**(code **)(*(long *)peVar3 + 0x58))(peVar3,local_100);
          local_80 = (snapshot *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<nuraft::snapshot,std::allocator<nuraft::snapshot>,unsigned_long&,unsigned_long&,std::shared_ptr<nuraft::cluster_config>&>
                    (&local_78,&local_80,(allocator<nuraft::snapshot> *)(local_f8 + 0x10),
                     (unsigned_long *)&local_100,&local_70,
                     (shared_ptr<nuraft::cluster_config> *)local_f8);
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 != (element_type *)0x0) &&
             (iVar11 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar11)) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_c8,"create snapshot idx %lu log_term %lu",local_100,local_70)
            ;
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x234,local_c8);
            if ((log_entry *)local_c8._0_8_ != (log_entry *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
          }
          _Var8._M_pi = local_78._M_pi;
          psVar7 = local_80;
          if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
            }
          }
          local_d8._M_id._M_thread = (id)0;
          pEStack_d0 = (EventAwaiter *)0x0;
          local_f8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          tStack_e0._M_id._M_thread = (id)0;
          local_f8._16_8_ = operator_new(0x28);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._16_8_)->_vptr__Sp_counted_base
               = (_func_int **)on_snapshot_completed;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._16_8_)->_M_use_count = 0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._16_8_)->_M_weak_count = 0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._16_8_ + 0x10))->
          _vptr__Sp_counted_base = (_func_int **)psVar7;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._16_8_ + 0x10))->_M_use_count
               = _Var8._M_pi;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._16_8_ + 0x20))->
          _vptr__Sp_counted_base = (_func_int **)this;
          pEStack_d0 = (EventAwaiter *)
                       std::
                       _Function_handler<void_(bool_&,_std::shared_ptr<std::exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::snapshot>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>_&,_bool,_std::shared_ptr<std::exception>_&)>_>
                       ::_M_invoke;
          local_d8._M_id._M_thread =
               (id)std::
                   _Function_handler<void_(bool_&,_std::shared_ptr<std::exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::snapshot>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>_&,_bool,_std::shared_ptr<std::exception>_&)>_>
                   ::_M_manager;
          local_c8._0_8_ = (log_entry *)0x0;
          local_c8._8_8_ = (element_type *)0x0;
          local_c8[0x10] = '\x01';
          local_b0._0_8_ = 0;
          local_b0._8_8_ = 0;
          local_b0._16_8_ = (EventAwaiter *)0x0;
          local_b0._24_8_ = 0;
          local_b0._32_8_ = 0;
          timer_helper::reset((timer_helper *)local_c8);
          peVar4 = (this->state_machine_).
                   super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (**(code **)(*(long *)peVar4 + 0x90))(peVar4,local_80,local_f8 + 0x10);
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 != (element_type *)0x0) &&
             (iVar11 = (**(code **)(*(long *)peVar2 + 0x38))(), uVar9 = local_70,
             pp_Var14 = local_100, 3 < iVar11)) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            uVar15 = timer_helper::get_us((timer_helper *)local_c8);
            msg_if_given_abi_cxx11_
                      (&local_48,"create snapshot idx %lu log_term %lu done: %lu us elapsed",
                       pp_Var14,uVar9,uVar15);
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x240,&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != &local_48.field_2) {
              operator_delete(local_48._M_dataplus._M_p);
            }
          }
          if (local_d8._M_id._M_thread != 0) {
            (*(code *)local_d8._M_id._M_thread)(local_f8 + 0x10,local_f8 + 0x10,3);
          }
          if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
          }
          bVar17 = true;
        }
      }
      else {
        bVar17 = false;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_);
      }
      goto LAB_001bec5d;
    }
  }
  bVar17 = false;
LAB_001bec5d:
  if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return bVar17;
}

Assistant:

bool raft_server::snapshot_and_compact(ulong committed_idx, bool forced_creation) {
    ptr<raft_params> params = ctx_->get_params();

    // get the latest configuration info
    ptr<cluster_config> conf = get_config();
    if ( conf->get_prev_log_idx() >= log_store_->next_slot() ) {
        // The latest config and previous config is not in log_store,
        // so skip the snapshot creation.
        return false;
    }

    auto snapshot_distance = (ulong)params->snapshot_distance_;
    // Randomized snapshot distance for the first creation.
    if ( params->enable_randomized_snapshot_creation_ &&
         !snp_in_progress_.load(std::memory_order_relaxed) &&
         !get_last_snapshot() &&
         params->snapshot_distance_ != 0 ) {
        snapshot_distance = first_snapshot_distance_;
    }

    if (!forced_creation) {
        // If `forced_creation == true`, ignore below conditions.
        if ( params->snapshot_distance_ == 0 ||
             ( committed_idx - log_store_->start_index() + 1 ) < snapshot_distance ) {
            // snapshot is disabled or the log store is not long enough
            return false;
        }

        if ( !state_machine_->chk_create_snapshot() ) {
            // User-defined state machine doesn't want to create a snapshot.
            return false;
        }
    }

    bool snapshot_in_action = false;
 try {
    bool f = false;
    ptr<snapshot> local_snp = get_last_snapshot();
    if ( ( forced_creation ||
           !local_snp ||
           ( committed_idx - local_snp->get_last_log_idx() ) >= snapshot_distance ) &&
         snp_in_progress_.compare_exchange_strong(f, true) )
    {
        snapshot_in_action = true;
        p_in("creating a snapshot for index %" PRIu64 "", committed_idx);

        while ( conf->get_log_idx() > committed_idx &&
                conf->get_prev_log_idx() >= log_store_->start_index() ) {
            ptr<log_entry> conf_log
                ( log_store_->entry_at( conf->get_prev_log_idx() ) );
            conf = cluster_config::deserialize(conf_log->get_buf());
        }

        if ( conf->get_log_idx() > committed_idx &&
             conf->get_prev_log_idx() > 0 &&
             conf->get_prev_log_idx() < log_store_->start_index() ) {
            if (!local_snp) {
                // LCOV_EXCL_START
                p_er("No snapshot could be found while no configuration "
                     "cannot be found in current committed logs, "
                     "this is a system error, exiting");
                ctx_->state_mgr_->system_exit(raft_err::N6_no_snapshot_found);
                ::exit(-1);
                return false;
                // LCOV_EXCL_STOP
            }
            conf = local_snp->get_last_config();

        } else if ( conf->get_log_idx() > committed_idx &&
                    conf->get_prev_log_idx() == 0 ) {
            // Modified by Jung-Sang Ahn in May, 2018:
            //  Since we remove configure from state machine
            //  (necessary when we clone a node to another node),
            //  config at log idx 1 may not be visiable in some condition.
            p_wn("config at log idx 1 is not availabe, "
                 "config log idx %" PRIu64 ", prev log idx %" PRIu64
                 ", committed idx %" PRIu64,
                 conf->get_log_idx(), conf->get_prev_log_idx(), committed_idx);
            //ctx_->state_mgr_->system_exit(raft_err::N7_no_config_at_idx_one);
            //::exit(-1);
            //return;
        }

        ulong log_term_to_compact = log_store_->term_at(committed_idx);
        ptr<snapshot> new_snapshot
            ( cs_new<snapshot>(committed_idx, log_term_to_compact, conf) );
        p_in( "create snapshot idx %" PRIu64 " log_term %" PRIu64,
              committed_idx, log_term_to_compact );
        cmd_result<bool>::handler_type handler =
            (cmd_result<bool>::handler_type)
            std::bind( &raft_server::on_snapshot_completed,
                       this,
                       new_snapshot,
                       std::placeholders::_1,
                       std::placeholders::_2 );
        timer_helper tt;
        state_machine_->create_snapshot(*new_snapshot, handler);
        p_in( "create snapshot idx %" PRIu64 " log_term %" PRIu64
              " done: %" PRIu64 " us elapsed",
              committed_idx, log_term_to_compact, tt.get_us() );

        snapshot_in_action = false;
        return true;
    }
    return false;

 } catch (std::exception &e) {
    p_er( "failed to compact logs at index %" PRIu64 " due to errors %s",
          committed_idx, e.what());
    if (snapshot_in_action) {
        bool val = true;
        snp_in_progress_.compare_exchange_strong(val, false);
    }
    return false;
 }
}